

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::IsProtobufLibraryBundledProtoFile(FileDescriptor *file)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  bool bVar1;
  DescriptorStringView this;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  size_t local_158;
  char *local_150;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_148;
  size_t local_138;
  char *local_130;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_128;
  size_t local_118;
  char *local_110;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_108;
  size_t local_f8;
  char *local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  size_t local_d8;
  char *local_d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  size_t local_b8;
  char *local_b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  size_t local_98;
  char *local_90;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  size_t local_78;
  char *local_70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_68;
  size_t local_58;
  char *local_50;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  string_view name;
  FileDescriptor *file_local;
  
  name._M_str = (char *)file;
  this = FileDescriptor::name_abi_cxx11_(file);
  local_38 = (basic_string_view<char,_std::char_traits<char>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  name._M_len = (size_t)local_38._M_str;
  local_28 = local_38._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"google/protobuf/any.proto");
  bVar1 = std::operator==(local_38,local_48);
  if (!bVar1) {
    local_58 = local_28;
    local_50 = (char *)name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"google/protobuf/api.proto");
    __x_07._M_str = local_50;
    __x_07._M_len = local_58;
    bVar1 = std::operator==(__x_07,local_68);
    if (!bVar1) {
      local_78 = local_28;
      local_70 = (char *)name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_88,"google/protobuf/duration.proto");
      __x_06._M_str = local_70;
      __x_06._M_len = local_78;
      bVar1 = std::operator==(__x_06,local_88);
      if (!bVar1) {
        local_98 = local_28;
        local_90 = (char *)name._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,"google/protobuf/empty.proto");
        __x_05._M_str = local_90;
        __x_05._M_len = local_98;
        bVar1 = std::operator==(__x_05,local_a8);
        if (!bVar1) {
          local_b8 = local_28;
          local_b0 = (char *)name._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_c8,"google/protobuf/field_mask.proto");
          __x_04._M_str = local_b0;
          __x_04._M_len = local_b8;
          bVar1 = std::operator==(__x_04,local_c8);
          if (!bVar1) {
            local_d8 = local_28;
            local_d0 = (char *)name._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_e8,"google/protobuf/source_context.proto");
            __x_03._M_str = local_d0;
            __x_03._M_len = local_d8;
            bVar1 = std::operator==(__x_03,local_e8);
            if (!bVar1) {
              local_f8 = local_28;
              local_f0 = (char *)name._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_108,"google/protobuf/struct.proto");
              __x_02._M_str = local_f0;
              __x_02._M_len = local_f8;
              bVar1 = std::operator==(__x_02,local_108);
              if (!bVar1) {
                local_118 = local_28;
                local_110 = (char *)name._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_128,"google/protobuf/timestamp.proto");
                __x_01._M_str = local_110;
                __x_01._M_len = local_118;
                bVar1 = std::operator==(__x_01,local_128);
                if (!bVar1) {
                  local_138 = local_28;
                  local_130 = (char *)name._M_len;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_148,"google/protobuf/type.proto");
                  __x_00._M_str = local_130;
                  __x_00._M_len = local_138;
                  bVar1 = std::operator==(__x_00,local_148);
                  if (!bVar1) {
                    local_158 = local_28;
                    local_150 = (char *)name._M_len;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_168,"google/protobuf/wrappers.proto");
                    __x._M_str = local_150;
                    __x._M_len = local_158;
                    bVar1 = std::operator==(__x,local_168);
                    if (!bVar1) {
                      return false;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool IsProtobufLibraryBundledProtoFile(const FileDescriptor* file) {
  // We don't check the name prefix or proto package because some files
  // (descriptor.proto), aren't shipped generated by the library, so this
  // seems to be the safest way to only catch the ones shipped.
  const absl::string_view name = file->name();
  if (name == "google/protobuf/any.proto" ||
      name == "google/protobuf/api.proto" ||
      name == "google/protobuf/duration.proto" ||
      name == "google/protobuf/empty.proto" ||
      name == "google/protobuf/field_mask.proto" ||
      name == "google/protobuf/source_context.proto" ||
      name == "google/protobuf/struct.proto" ||
      name == "google/protobuf/timestamp.proto" ||
      name == "google/protobuf/type.proto" ||
      name == "google/protobuf/wrappers.proto") {
    return true;
  }
  return false;
}